

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePolicyCommand.cxx
# Opt level: O2

bool __thiscall
cmCMakePolicyCommand::HandleGetWarningMode
          (cmCMakePolicyCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer pbVar1;
  cmMakefile *this_00;
  bool bVar2;
  ostream *poVar3;
  PolicyID id;
  PolicyID pid;
  ostringstream e;
  PolicyID local_1bc;
  string local_1b8;
  string local_198 [11];
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 == 0x60) {
    bVar2 = cmPolicies::GetPolicyID(pbVar1[1]._M_dataplus._M_p,&local_1bc);
    if (bVar2) {
      this_00 = (this->super_cmCommand).Makefile;
      cmPolicies::GetPolicyWarning_abi_cxx11_(local_198,(cmPolicies *)(ulong)local_1bc,id);
      cmMakefile::AddDefinition(this_00,pbVar1 + 2,local_198[0]._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)local_198);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
      poVar3 = std::operator<<((ostream *)local_198,"GET_WARNING given policy \"");
      poVar3 = std::operator<<(poVar3,(string *)(pbVar1 + 1));
      std::operator<<(poVar3,"\" which is not known to this version of CMake.");
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(&this->super_cmCommand,&local_1b8);
      std::__cxx11::string::~string((string *)&local_1b8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
    }
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_198,"GET_WARNING must be given exactly 2 additional arguments.",
               (allocator<char> *)&local_1b8);
    cmCommand::SetError(&this->super_cmCommand,local_198);
    std::__cxx11::string::~string((string *)local_198);
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool cmCMakePolicyCommand::HandleGetWarningMode(
  std::vector<std::string> const& args)
{
  if (args.size() != 3) {
    this->SetError(
      "GET_WARNING must be given exactly 2 additional arguments.");
    return false;
  }

  // Get arguments.
  std::string const& id = args[1];
  std::string const& var = args[2];

  // Lookup the policy number.
  cmPolicies::PolicyID pid;
  if (!cmPolicies::GetPolicyID(id.c_str(), pid)) {
    std::ostringstream e;
    e << "GET_WARNING given policy \"" << id
      << "\" which is not known to this version of CMake.";
    this->SetError(e.str());
    return false;
  }

  // Lookup the policy warning.
  this->Makefile->AddDefinition(var,
                                cmPolicies::GetPolicyWarning(pid).c_str());

  return true;
}